

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastMdR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  TcParseTableBase *pTVar5;
  bool bVar6;
  uint uVar7;
  MessageLite *pMVar8;
  ulong uVar9;
  EpsCopyInputStream *pEVar10;
  char *pcVar11;
  string *psVar12;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar13;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar14;
  long lVar15;
  EpsCopyInputStream *ptr_00;
  uint *puVar16;
  pair<const_char_*,_int> pVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  EpsCopyInputStream *local_58 [2];
  EpsCopyInputStream *local_48;
  TcParseTableBase *local_40;
  TcParseTableBase *local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  local_48 = (EpsCopyInputStream *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)local_48 & 7) != 0) {
    AlignFail(local_48);
  }
  cVar1 = *ptr;
  local_38 = MessageLite::GetTcParseTable
                       (*(MessageLite **)
                         ((long)&table->has_bits_offset +
                         ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  local_40 = local_38 + 1;
  while( true ) {
    ptr_00 = local_48;
    pMVar8 = AddMessage(local_38,(RepeatedPtrFieldBase *)local_48);
    bVar2 = *(byte *)((long)&((EpsCopyInputStream *)ptr)->limit_end_ + 1);
    aVar13.data._1_7_ = 0;
    aVar13.data._0_1_ = bVar2;
    if ((char)bVar2 < '\0') {
      ptr_00 = (EpsCopyInputStream *)(ulong)(uint)bVar2;
      pVar17 = ReadSizeFallback((char *)((long)&((EpsCopyInputStream *)ptr)->limit_end_ + 1),
                                (uint)bVar2);
      auVar18._8_8_ = pVar17._8_8_;
      auVar18._0_8_ = local_58[0];
      if (pVar17.first == (char *)0x0) break;
      aVar13.data = pVar17._8_8_ & 0xffffffff;
    }
    else {
      pVar17._8_8_ = extraout_RDX;
      pVar17.first = (char *)((long)&((EpsCopyInputStream *)ptr)->limit_end_ + 2);
    }
    auVar18._8_8_ = pVar17._8_8_;
    auVar18._0_8_ = local_58[0];
    if (ctx->depth_ < 1) break;
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_58,(char *)ctx,(int)pVar17.first);
    pTVar5 = local_40;
    iVar4 = (int)local_58[0];
    lVar15 = (long)ctx->depth_ + -1;
    iVar14 = (int)lVar15;
    ctx->depth_ = iVar14;
    local_58[0] = (EpsCopyInputStream *)pVar17.first;
    while( true ) {
      ptr_00 = (EpsCopyInputStream *)local_58;
      bVar6 = EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)local_58,ctx->group_depth_);
      auVar18._8_8_ = extraout_RDX_00;
      auVar18._0_8_ = local_58[0];
      if (bVar6) break;
      uVar7 = (uint)pTVar5[-1].fast_idx_mask & (uint)*(ushort *)&local_58[0]->limit_end_;
      if ((uVar7 & 7) != 0) goto LAB_0028d19e;
      uVar9 = (ulong)(uVar7 & 0xfffffff8);
      aVar13.data = (ulong)*(ushort *)&local_58[0]->limit_end_ ^
                    *(ulong *)(&pTVar5->fast_idx_mask + uVar9 * 2);
      auVar18 = (**(code **)(&pTVar5->has_bits_offset + uVar9))
                          (pMVar8,local_58[0],ctx,aVar13.data,pTVar5 + -1,0);
      ptr_00 = local_58[0];
      if ((auVar18._0_8_ == (EpsCopyInputStream *)0x0) ||
         (local_58[0] = auVar18._0_8_, (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
      break;
    }
    local_58[0] = auVar18._0_8_;
    ptr = (char *)local_58[0];
    if ((pTVar5[-1].field_0x9 & 1) != 0) {
      ptr_00 = local_58[0];
      auVar19 = (undefined1  [16])(*pTVar5[-1].post_loop_handler)(pMVar8,(char *)local_58[0],ctx);
      auVar18._8_8_ = auVar19._8_8_;
      auVar18._0_8_ = local_58[0];
      ptr = (char *)auVar19._0_8_;
    }
    local_58[0] = auVar18._0_8_;
    iVar3 = ctx->depth_;
    if (((EpsCopyInputStream *)ptr != (EpsCopyInputStream *)0x0) && (iVar14 != iVar3)) {
      psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          (lVar15,(long)iVar3,"old_depth == depth_");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                 ,1099,*(undefined8 *)(psVar12 + 8),*(undefined8 *)psVar12);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_58);
    }
    ctx->depth_ = iVar3 + 1;
    uVar7 = iVar4 + (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar7;
    if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) break;
    pEVar10 = (EpsCopyInputStream *)
              ((ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar7 >> 0x1f & uVar7));
    (ctx->super_EpsCopyInputStream).limit_end_ = (char *)pEVar10;
    if ((EpsCopyInputStream *)ptr == (EpsCopyInputStream *)0x0) break;
    if (pEVar10 <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar16 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar16 & 3) != 0) {
          AlignFail();
        }
        *puVar16 = *puVar16 | (uint)hasbits;
      }
      return (char *)(EpsCopyInputStream *)ptr;
    }
    if (*(char *)&((EpsCopyInputStream *)ptr)->limit_end_ != cVar1) {
      uVar7 = (uint)table->fast_idx_mask & (uint)*(ushort *)&((EpsCopyInputStream *)ptr)->limit_end_
      ;
      if ((uVar7 & 7) == 0) {
        uVar9 = (ulong)(uVar7 & 0xfffffff8);
        pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar9))
                                    (msg,ptr,ctx,
                                     (ulong)*(ushort *)&((EpsCopyInputStream *)ptr)->limit_end_ ^
                                     *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2),table,hasbits);
        return pcVar11;
      }
LAB_0028d19e:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  }
  local_58[0] = auVar18._0_8_;
  pcVar11 = Error(msg,(char *)ptr_00,auVar18._8_8_,(TcFieldData)aVar13,table,hasbits);
  return pcVar11;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMdR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint8_t, false, false>(
      PROTOBUF_TC_PARAM_PASS);
}